

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [9])

{
  size_t sVar1;
  ostream *poVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  poVar2 = (ostream *)(local_20.ptr_ + 0x10);
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*value,sVar1);
  AppendMessage(this,(Message *)&local_20);
  if (local_20.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }